

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_decompressSequences
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  BYTE *pBVar1;
  byte bVar2;
  byte bVar3;
  undefined8 uVar4;
  seq_t sequence;
  U32 i;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  BYTE *pBVar12;
  size_t __n;
  ulong __n_00;
  BYTE *oend;
  BYTE *__dest;
  int iVar13;
  BYTE *pBVar14;
  void *pvVar15;
  BYTE *pBVar16;
  BYTE *litPtr;
  BYTE *local_110;
  BIT_DStream_t local_108;
  ZSTD_fseState local_e0;
  ZSTD_fseState local_d0;
  ZSTD_fseState local_c0;
  size_t local_b0 [3];
  BYTE *local_98 [3];
  ZSTD_DCtx *local_80;
  size_t local_78;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *local_60;
  BYTE *local_58;
  ulong local_50;
  size_t sStack_48;
  size_t local_40;
  void *local_38;
  
  if (dctx->bmi2 != 0) {
    sVar5 = ZSTD_decompressSequences_bmi2
                      (dctx,dst,maxDstSize,seqStart,seqSize,nbSeq,isLongOffset,frame);
    return sVar5;
  }
  if (dctx->litBufferLocation == ZSTD_not_in_dst) {
    pBVar16 = (BYTE *)(maxDstSize + (long)dst);
  }
  else {
    pBVar16 = dctx->litBuffer;
  }
  local_110 = dctx->litPtr;
  sVar5 = dctx->litSize;
  pBVar12 = local_110 + sVar5;
  pvVar15 = dst;
  if (nbSeq == 0) {
LAB_0019c64a:
    __n = (long)pBVar12 - (long)local_110;
    sVar8 = 0xffffffffffffffba;
    if (__n <= (ulong)((long)pBVar16 - (long)dst)) {
      if ((BYTE *)dst == (BYTE *)0x0) {
        pBVar16 = (BYTE *)0x0;
      }
      else {
        memcpy(dst,local_110,__n);
        pBVar16 = (BYTE *)((long)dst + __n);
      }
      sVar8 = (long)pBVar16 - (long)pvVar15;
    }
  }
  else {
    local_60 = (BYTE *)dctx->prefixStart;
    local_68 = (BYTE *)dctx->virtualStart;
    local_70 = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    lVar6 = -0xc;
    do {
      *(ulong *)((long)local_98 + lVar6 * 2) =
           (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar6);
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0);
    local_78 = 0xffffffffffffffec;
    sVar8 = local_78;
    if (seqSize != 0) {
      local_108.limitPtr = (char *)((long)seqStart + 8);
      if (seqSize < 8) {
        local_108.bitContainer = (size_t)*seqStart;
        switch(seqSize) {
        case 7:
          local_108.bitContainer =
               local_108.bitContainer | (ulong)*(byte *)((long)seqStart + 6) << 0x30;
        case 6:
          local_108.bitContainer =
               local_108.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
        case 5:
          local_108.bitContainer =
               local_108.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
        case 4:
          local_108.bitContainer =
               local_108.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
        case 3:
          local_108.bitContainer =
               local_108.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
        case 2:
          local_108.bitContainer =
               (ulong)*(byte *)((long)seqStart + 1) * 0x100 + local_108.bitContainer;
        }
        bVar2 = *(byte *)((long)seqStart + (seqSize - 1));
        if (bVar2 != 0) {
          uVar11 = 0x1f;
          if (bVar2 != 0) {
            for (; bVar2 >> uVar11 == 0; uVar11 = uVar11 - 1) {
            }
          }
          local_108.bitsConsumed = (uVar11 ^ 0x1f) + (int)seqSize * -8 + 0x29;
          local_108.ptr = (char *)seqStart;
LAB_0019be8a:
          local_108.start = (char *)seqStart;
          local_98[1] = local_110 + sVar5;
          local_80 = dctx;
          ZSTD_initFseState(&local_e0,&local_108,dctx->LLTptr);
          ZSTD_initFseState(&local_d0,&local_108,dctx->OFTptr);
          ZSTD_initFseState(&local_c0,&local_108,dctx->MLTptr);
          if (dst == (void *)0x0) {
            __assert_fail("dst != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xaabe,
                          "size_t ZSTD_decompressSequences_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                         );
          }
          local_98[0] = pBVar16;
          local_58 = pBVar16 + -0x20;
          local_38 = dst;
LAB_0019bf37:
          do {
            pBVar16 = local_60;
            sVar5 = local_b0[1];
            local_98[2] = (BYTE *)dst;
            bVar2 = local_e0.table[local_e0.state].nbAdditionalBits;
            if (0x10 < bVar2) {
              __assert_fail("llBits <= MaxLLBits",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa948,
                            "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
            }
            bVar10 = local_c0.table[local_c0.state].nbAdditionalBits;
            if (0x10 < bVar10) {
              __assert_fail("mlBits <= MaxMLBits",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa949,
                            "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
            }
            bVar3 = local_d0.table[local_d0.state].nbAdditionalBits;
            if (0x1f < bVar3) {
              __assert_fail("ofBits <= MaxOff",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa94a,
                            "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
            }
            __n_00 = (ulong)local_c0.table[local_c0.state].baseValue;
            uVar11 = local_e0.table[local_e0.state].baseValue;
            local_50 = (ulong)uVar11;
            bVar9 = (byte)local_108.bitsConsumed;
            if (bVar3 < 2) {
              if (bVar3 != 0) {
                local_108.bitsConsumed = local_108.bitsConsumed + 1;
                lVar6 = (ulong)(local_d0.table[local_d0.state].baseValue + (uint)(uVar11 == 0)) -
                        ((long)(local_108.bitContainer << (bVar9 & 0x3f)) >> 0x3f);
                if (lVar6 == 3) {
                  local_40 = (local_b0[0] - 1) + (ulong)(local_b0[0] == 1);
LAB_0019c582:
                  local_b0[2] = local_b0[1];
                }
                else {
                  local_40 = local_b0[lVar6] + (ulong)(local_b0[lVar6] == 0);
                  if (lVar6 != 1) goto LAB_0019c582;
                }
                local_b0[1] = local_b0[0];
                goto LAB_0019bffd;
              }
              local_40 = local_b0[uVar11 == 0];
              local_b0[1] = local_b0[uVar11 != 0];
              local_b0[0] = local_40;
            }
            else {
              local_108.bitsConsumed = local_108.bitsConsumed + bVar3;
              local_40 = ((local_108.bitContainer << (bVar9 & 0x3f)) >> (-bVar3 & 0x3f)) +
                         (ulong)local_d0.table[local_d0.state].baseValue;
              local_b0[1] = local_b0[0];
              local_b0[2] = sVar5;
LAB_0019bffd:
              local_b0[1] = local_b0[0];
              local_b0[0] = local_40;
            }
            if (bVar10 != 0) {
              bVar9 = (byte)local_108.bitsConsumed;
              local_108.bitsConsumed = local_108.bitsConsumed + bVar10;
              __n_00 = __n_00 + ((local_108.bitContainer << (bVar9 & 0x3f)) >> (-bVar10 & 0x3f));
            }
            if ((0x1e < (byte)(bVar10 + bVar2 + bVar3)) && (local_108.bitsConsumed < 0x41)) {
              if (local_108.ptr < local_108.limitPtr) {
                if (local_108.ptr == local_108.start) goto LAB_0019c06e;
                uVar7 = (ulong)(uint)((int)local_108.ptr - (int)local_108.start);
                if (local_108.start <=
                    (ulong *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
                  uVar7 = (ulong)(local_108.bitsConsumed >> 3);
                }
                local_108.bitsConsumed = local_108.bitsConsumed + (int)uVar7 * -8;
              }
              else {
                uVar7 = (ulong)(local_108.bitsConsumed >> 3);
                local_108.bitsConsumed = local_108.bitsConsumed & 7;
              }
              local_108.ptr = (char *)((long)local_108.ptr - uVar7);
              local_108.bitContainer = *(size_t *)local_108.ptr;
            }
LAB_0019c06e:
            if (bVar2 != 0) {
              bVar10 = (byte)local_108.bitsConsumed;
              local_108.bitsConsumed = local_108.bitsConsumed + bVar2;
              local_50 = local_50 + ((local_108.bitContainer << (bVar10 & 0x3f)) >> (-bVar2 & 0x3f))
              ;
            }
            iVar13 = local_108.bitsConsumed + local_e0.table[local_e0.state].nbBits;
            local_e0.state =
                 (~(-1L << (local_e0.table[local_e0.state].nbBits & 0x3f)) &
                 local_108.bitContainer >> (-(char)iVar13 & 0x3fU)) +
                 (ulong)local_e0.table[local_e0.state].nextState;
            iVar13 = iVar13 + (uint)local_c0.table[local_c0.state].nbBits;
            local_c0.state =
                 (~(-1L << (local_c0.table[local_c0.state].nbBits & 0x3f)) &
                 local_108.bitContainer >> (-(char)iVar13 & 0x3fU)) +
                 (ulong)local_c0.table[local_c0.state].nextState;
            local_108.bitsConsumed = iVar13 + (uint)local_d0.table[local_d0.state].nbBits;
            local_d0.state =
                 (~(-1L << (local_d0.table[local_d0.state].nbBits & 0x3f)) &
                 local_108.bitContainer >> (-(char)local_108.bitsConsumed & 0x3fU)) +
                 (ulong)local_d0.table[local_d0.state].nextState;
            sStack_48 = __n_00;
            pBVar12 = local_110 + local_50;
            local_b0[0] = local_40;
            if (local_98[1] < pBVar12) {
LAB_0019c33c:
              sequence.matchLength = __n_00;
              sequence.litLength = local_50;
              sequence.offset = local_40;
              uVar7 = ZSTD_execSequenceEnd
                                ((BYTE *)dst,local_98[0],sequence,&local_110,local_98[1],local_60,
                                 local_68,local_70);
            }
            else {
              uVar7 = local_50 + __n_00;
              pBVar1 = (BYTE *)((long)dst + uVar7);
              if (local_58 < pBVar1) goto LAB_0019c33c;
              if ((long)local_50 < 0) {
                __assert_fail("op <= oLitEnd",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa863,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if ((long)uVar7 <= (long)local_50) {
                __assert_fail("oLitEnd < oMatchEnd",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa864,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if (local_98[0] < pBVar1) {
                __assert_fail("oMatchEnd <= oend",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa865,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              __dest = (BYTE *)((long)dst + local_50);
              if (local_58 < __dest) {
                __assert_fail("oLitEnd <= oend_w",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa867,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              uVar4 = *(undefined8 *)(local_110 + 8);
              *(undefined8 *)dst = *(undefined8 *)local_110;
              *(undefined8 *)((long)dst + 8) = uVar4;
              sVar5 = local_40;
              if (0x10 < local_50) {
                if ((BYTE *)0xffffffffffffffe0 <
                    (BYTE *)((long)dst + 0x10) + (-0x10 - (long)(local_110 + 0x10)))
                goto LAB_0019c779;
                uVar4 = *(undefined8 *)(local_110 + 0x18);
                *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)(local_110 + 0x10);
                *(undefined8 *)((long)dst + 0x18) = uVar4;
                if (0x20 < local_50) {
                  lVar6 = 0;
                  do {
                    uVar4 = *(undefined8 *)(local_110 + lVar6 + 0x20 + 8);
                    pBVar14 = (BYTE *)((long)dst + lVar6 + 0x20);
                    *(undefined8 *)pBVar14 = *(undefined8 *)(local_110 + lVar6 + 0x20);
                    *(undefined8 *)(pBVar14 + 8) = uVar4;
                    uVar4 = *(undefined8 *)(local_110 + lVar6 + 0x30 + 8);
                    *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(local_110 + lVar6 + 0x30);
                    *(undefined8 *)(pBVar14 + 0x18) = uVar4;
                    lVar6 = lVar6 + 0x20;
                    sVar5 = local_40;
                  } while (pBVar14 + 0x20 < __dest);
                }
              }
              pBVar14 = __dest + -local_40;
              local_110 = pBVar12;
              if ((ulong)((long)__dest - (long)local_60) < sVar5) {
                if ((ulong)((long)__dest - (long)local_68) < sVar5) {
                  return local_78;
                }
                lVar6 = (long)(__dest + -local_40) - (long)local_60;
                pBVar12 = local_70 + lVar6;
                if (local_70 < pBVar12 + __n_00) {
                  memmove(__dest,pBVar12,-lVar6);
                  __dest = __dest + -lVar6;
                  __n_00 = __n_00 + lVar6;
                  sStack_48 = __n_00;
                  pBVar14 = pBVar16;
                  goto LAB_0019c21e;
                }
                memmove(__dest,pBVar12,__n_00);
                dst = local_98[2];
              }
              else {
LAB_0019c21e:
                sStack_48 = __n_00;
                if (pBVar1 < __dest) {
                  __assert_fail("op <= oMatchEnd",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xa888,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                if (pBVar14 < pBVar16) {
                  __assert_fail("match >= prefixStart",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xa88a,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                if (__n_00 == 0) {
                  __assert_fail("sequence.matchLength >= 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xa88b,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                dst = local_98[2];
                if (sVar5 < 0x10) {
                  if (__dest < pBVar14) {
                    __assert_fail("*ip <= *op",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xa783,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
                  }
                  if (sVar5 < 8) {
                    iVar13 = *(int *)(ZSTD_overlapCopy8_dec64table + sVar5 * 4);
                    *__dest = *pBVar14;
                    __dest[1] = pBVar14[1];
                    __dest[2] = pBVar14[2];
                    __dest[3] = pBVar14[3];
                    pBVar16 = pBVar14 + *(uint *)(ZSTD_overlapCopy8_dec32table + sVar5 * 4);
                    pBVar14 = pBVar14 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + sVar5 * 4)
                                        - (long)iVar13);
                    *(undefined4 *)(__dest + 4) = *(undefined4 *)pBVar16;
                  }
                  else {
                    *(undefined8 *)__dest = *(undefined8 *)pBVar14;
                  }
                  pBVar16 = pBVar14 + 8;
                  pBVar12 = __dest + 8;
                  if ((long)pBVar12 - (long)pBVar16 < 8) {
                    __assert_fail("*op - *ip >= 8",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xa795,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
                  }
                  if (8 < __n_00) {
                    if (pBVar1 <= pBVar12) {
                      __assert_fail("op < oMatchEnd",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xa89f,
                                    "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                                   );
                    }
                    if ((ulong)((long)pBVar12 - (long)pBVar16) < 0x10) {
                      do {
                        *(undefined8 *)pBVar12 = *(undefined8 *)pBVar16;
                        pBVar12 = pBVar12 + 8;
                        pBVar16 = pBVar16 + 8;
                      } while (pBVar12 < __dest + __n_00);
                    }
                    else {
                      uVar4 = *(undefined8 *)(pBVar14 + 0x10);
                      *(undefined8 *)pBVar12 = *(undefined8 *)pBVar16;
                      *(undefined8 *)(__dest + 0x10) = uVar4;
                      if (0x18 < (long)__n_00) {
                        lVar6 = 0;
                        do {
                          uVar4 = *(undefined8 *)(pBVar14 + lVar6 + 0x18 + 8);
                          pBVar16 = __dest + lVar6 + 0x18;
                          *(undefined8 *)pBVar16 = *(undefined8 *)(pBVar14 + lVar6 + 0x18);
                          *(undefined8 *)(pBVar16 + 8) = uVar4;
                          uVar4 = *(undefined8 *)(pBVar14 + lVar6 + 0x28 + 8);
                          *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)(pBVar14 + lVar6 + 0x28);
                          *(undefined8 *)(pBVar16 + 0x18) = uVar4;
                          lVar6 = lVar6 + 0x20;
                        } while (pBVar16 + 0x20 < __dest + __n_00);
                      }
                    }
                  }
                }
                else {
                  if ((BYTE *)0xffffffffffffffe0 < __dest + (-0x10 - (long)pBVar14)) {
LAB_0019c779:
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x36a6,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  uVar4 = *(undefined8 *)(pBVar14 + 8);
                  *(undefined8 *)__dest = *(undefined8 *)pBVar14;
                  *(undefined8 *)(__dest + 8) = uVar4;
                  if (0x10 < (long)__n_00) {
                    lVar6 = 0x10;
                    do {
                      uVar4 = *(undefined8 *)(pBVar14 + lVar6 + 8);
                      pBVar16 = __dest + lVar6;
                      *(undefined8 *)pBVar16 = *(undefined8 *)(pBVar14 + lVar6);
                      *(undefined8 *)(pBVar16 + 8) = uVar4;
                      uVar4 = *(undefined8 *)(pBVar14 + lVar6 + 0x10 + 8);
                      *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)(pBVar14 + lVar6 + 0x10);
                      *(undefined8 *)(pBVar16 + 0x18) = uVar4;
                      lVar6 = lVar6 + 0x20;
                    } while (pBVar16 + 0x20 < __dest + __n_00);
                  }
                }
              }
            }
            if (0xffffffffffffff88 < uVar7) {
              return uVar7;
            }
            dst = (void *)((long)dst + uVar7);
            nbSeq = nbSeq + -1;
            if (nbSeq == 0) {
              if (local_108.bitsConsumed < 0x41) {
                if (local_108.bitsConsumed != 0x40) {
                  return local_78;
                }
                if (local_108.limitPtr <= local_108.ptr) {
                  return local_78;
                }
                if (local_108.ptr != local_108.start) {
                  return local_78;
                }
              }
              lVar6 = 0;
              do {
                (local_80->entropy).rep[lVar6] = (U32)local_b0[lVar6];
                lVar6 = lVar6 + 1;
                pBVar12 = local_98[1];
                pvVar15 = local_38;
                pBVar16 = local_98[0];
              } while (lVar6 != 3);
              goto LAB_0019c64a;
            }
          } while (0x40 < local_108.bitsConsumed);
          if (local_108.ptr < local_108.limitPtr) {
            if (local_108.ptr == local_108.start) goto LAB_0019bf37;
            uVar11 = (int)local_108.ptr - (int)local_108.start;
            if (local_108.start <=
                (ulong *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
              uVar11 = local_108.bitsConsumed >> 3;
            }
            local_108.bitsConsumed = local_108.bitsConsumed + uVar11 * -8;
          }
          else {
            uVar11 = local_108.bitsConsumed >> 3;
            local_108.bitsConsumed = local_108.bitsConsumed & 7;
          }
          local_108.ptr = (char *)((long)local_108.ptr - (ulong)uVar11);
          local_108.bitContainer = *(size_t *)local_108.ptr;
          goto LAB_0019bf37;
        }
      }
      else {
        local_108.ptr = (char *)((long)seqStart + (seqSize - 8));
        local_108.bitContainer = *(size_t *)local_108.ptr;
        if (local_108.bitContainer >> 0x38 != 0) {
          uVar11 = 0x1f;
          bVar2 = (byte)(local_108.bitContainer >> 0x38);
          if (bVar2 != 0) {
            for (; bVar2 >> uVar11 == 0; uVar11 = uVar11 - 1) {
            }
          }
          local_108.bitsConsumed = ~uVar11 + 9;
          if (seqSize < 0xffffffffffffff89) goto LAB_0019be8a;
        }
      }
    }
  }
  return sVar8;
}

Assistant:

static size_t
ZSTD_decompressSequences(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                   const void* seqStart, size_t seqSize, int nbSeq,
                   const ZSTD_longOffset_e isLongOffset,
                   const int frame)
{
    DEBUGLOG(5, "ZSTD_decompressSequences");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequences_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
    }
#endif
    return ZSTD_decompressSequences_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}